

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O3

void __thiscall ProjectWriter::writeEnergy(ProjectWriter *this)

{
  undefined1 *puVar1;
  Link *pLVar2;
  long lVar3;
  _func_int **pp_Var4;
  pointer pcVar5;
  int iVar6;
  ostream *poVar7;
  pointer ppLVar8;
  Pump *pump;
  string local_58;
  pointer local_38;
  
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n[ENERGY]\n",10);
  Options::energyOptionsToStr_abi_cxx11_(&local_58,&this->network->options,this->network);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  ppLVar8 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (this->network->links).super__Vector_base<Link_*,_std::allocator<Link_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppLVar8 != local_38) {
    do {
      pLVar2 = *ppLVar8;
      iVar6 = (*(pLVar2->super_Element)._vptr_Element[2])(pLVar2);
      if (iVar6 == 1) {
        lVar3 = *(long *)&this->field_0x18;
        *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) =
             *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x20;
        *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) =
             *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)(&this->field_0x20 + *(long *)(lVar3 + -0x18)) = 4;
        if (pLVar2[2].super_Element._vptr_Element != (_func_int **)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"PUMP  ",6);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(pLVar2->super_Element).name._M_dataplus._M_p,
                              (pLVar2->super_Element).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"EFFIC  ",7);
          pp_Var4 = pLVar2[2].super_Element._vptr_Element;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(char *)pp_Var4[1],(long)pp_Var4[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
        if (0.0 < (double)pLVar2[2].super_Element.name._M_string_length) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"PUMP  ",6);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(pLVar2->super_Element).name._M_dataplus._M_p,
                              (pLVar2->super_Element).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"PRICE  ",7);
          poVar7 = std::ostream::_M_insert<double>
                             ((double)pLVar2[2].super_Element.name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
        if (pLVar2[2].super_Element.name._M_dataplus._M_p != (pointer)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"PUMP  ",6);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,(pLVar2->super_Element).name._M_dataplus._M_p,
                              (pLVar2->super_Element).name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"PATTERN  ",9);
          pcVar5 = pLVar2[2].super_Element.name._M_dataplus._M_p;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)puVar1,*(char **)(pcVar5 + 8),*(long *)(pcVar5 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
      }
      ppLVar8 = ppLVar8 + 1;
    } while (ppLVar8 != local_38);
  }
  return;
}

Assistant:

void ProjectWriter::writeEnergy()
{
    fout << "\n[ENERGY]\n";
    fout << network->options.energyOptionsToStr(network);
    for (Link* link : network->links)
    {
    	if ( link->type() == Link::PUMP )
    	{
    	    Pump* pump = static_cast<Pump*>(link);
    	    fout << left << fixed << setprecision(4);
    	    if ( pump->efficCurve )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "EFFIC  ";
    	        fout << pump->efficCurve->name << "\n";
    	    }

    	    if ( pump->costPerKwh > 0.0 )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "PRICE  " << pump->costPerKwh << "\n";
    	    }

    	    if ( pump->costPattern )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "PATTERN  ";
    	        fout << pump->costPattern->name << "\n";
    	    }
    	}
    }
}